

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O2

ON_Font * __thiscall
ON_ManagedFonts::GetFromSerialNumber(ON_ManagedFonts *this,uint managed_font_serial_number)

{
  uint uVar1;
  ON_Font **ppOVar2;
  ulong uVar3;
  ulong uVar4;
  
  if ((this->m_managed_fonts).m_by_index.m_count == 0) {
    Internal_AddManagedFont(this,&ON_Font::Default,(ON_FontMetrics *)0x0);
  }
  if (managed_font_serial_number != 0) {
    if (ON_Font::Default.m_runtime_serial_number == managed_font_serial_number) {
      return &ON_Font::Default;
    }
    ppOVar2 = (this->m_managed_fonts).m_by_index.m_a;
    uVar1 = (this->m_managed_fonts).m_by_index.m_count;
    uVar4 = (ulong)uVar1;
    if (uVar1 < managed_font_serial_number) {
      if (ppOVar2 == (ON_Font **)0x0 || uVar4 == 0) {
        return (ON_Font *)0x0;
      }
    }
    else if (ppOVar2[managed_font_serial_number - 1]->m_runtime_serial_number ==
             managed_font_serial_number) {
      return ppOVar2[managed_font_serial_number - 1];
    }
    uVar1 = (*ppOVar2)->m_runtime_serial_number;
    if (uVar1 <= managed_font_serial_number) {
      if (uVar1 == managed_font_serial_number) {
        return *ppOVar2;
      }
      uVar1 = ppOVar2[uVar4 - 1]->m_runtime_serial_number;
      if (managed_font_serial_number <= uVar1) {
        if (uVar1 == managed_font_serial_number) {
          return ppOVar2[uVar4 - 1];
        }
        while (uVar3 = uVar4, uVar3 != 0) {
          uVar4 = uVar3 >> 1;
          uVar1 = ppOVar2[uVar4]->m_runtime_serial_number;
          if (uVar1 <= managed_font_serial_number) {
            if (managed_font_serial_number <= uVar1) {
              return ppOVar2[uVar4];
            }
            ppOVar2 = ppOVar2 + uVar4 + 1;
            uVar4 = uVar3 - (uVar4 + 1);
          }
        }
      }
    }
    return (ON_Font *)0x0;
  }
  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_font.cpp"
             ,0x341,"","managed_font_serial_number parameter must be >= 1");
  return (ON_Font *)0x0;
}

Assistant:

const ON_Font* ON_ManagedFonts::GetFromSerialNumber(
  unsigned int managed_font_serial_number
  )
{
  if (0 == m_managed_fonts.Count())
  {
    // Put ON_Font::Default as the first entry in this list.
    Internal_AddManagedFont(&ON_Font::Default, nullptr);
  }
  if (managed_font_serial_number < 1)
  {
    ON_ERROR("managed_font_serial_number parameter must be >= 1");
    return nullptr;
  }

  if ( managed_font_serial_number == ON_Font::Default.RuntimeSerialNumber() )
    return &ON_Font::Default;

  const ON_Font* const * managed_fonts = m_managed_fonts.m_by_index.Array();
  const unsigned int font_count = m_managed_fonts.m_by_index.UnsignedCount();

  if (managed_font_serial_number <= font_count
    && managed_font_serial_number == managed_fonts[managed_font_serial_number - 1]->RuntimeSerialNumber())
  {
    // This test should always find the managed font as long as the current numbering scheme is used.
    return managed_fonts[managed_font_serial_number - 1];
  }
  
  return
    (font_count > 0)
    ? Internal_BinarySearchForManagedFontSerialNumber(managed_font_serial_number, managed_fonts, font_count)
    : nullptr;
}